

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Reader __thiscall capnp::_::OrphanBuilder::asTextReader(OrphanBuilder *this)

{
  void **ppvVar1;
  byte bVar2;
  word *pwVar3;
  Arena *pAVar4;
  ReadLimiter *pRVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  void **ppvVar10;
  uint uVar11;
  ulong uVar12;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *pDVar13;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *unaff_R15;
  bool bVar14;
  Reader RVar15;
  SegmentReader *newSegment;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentBuilder *local_40;
  uint size;
  
  local_40 = this->segment;
  uVar11 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) != 0 || uVar11 != 0) {
    ppvVar10 = (void **)this->location;
    pDVar13 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)this;
    if ((uVar11 & 3) == 2 && local_40 != (SegmentBuilder *)0x0) {
      iVar6 = (*((local_40->super_SegmentReader).arena)->_vptr_Arena[2])();
      local_40 = (SegmentBuilder *)CONCAT44(extraout_var,iVar6);
      _kjCondition.left = (SegmentReader **)&local_40;
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = local_40 != (SegmentBuilder *)0x0;
      if (local_40 == (SegmentBuilder *)0x0) {
        unaff_R15 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  ((Fault *)unaff_R15,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition
                   ,(char (*) [49])"Message contains far pointer to unknown segment.");
      }
      else {
        uVar11 = (uint)(this->tag).content;
        uVar7 = (ulong)(uVar11 >> 3);
        uVar9 = (local_40->super_SegmentReader).ptr.size_;
        if ((long)uVar9 < (long)uVar7) {
          uVar7 = uVar9;
        }
        pDVar13 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)
                  ((local_40->super_SegmentReader).ptr.ptr + uVar7);
        if (local_40 == (SegmentBuilder *)0x0) {
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,1);
LAB_001281a8:
          if (((this->tag).content & 4) == 0) {
            ppvVar1 = &pDVar13->right;
            lVar8 = (long)(*(int *)&pDVar13->left >> 2);
            unaff_R15 = pDVar13;
            if (local_40 == (SegmentBuilder *)0x0) {
              ppvVar10 = ppvVar1 + lVar8;
            }
            else {
              pwVar3 = (local_40->super_SegmentReader).ptr.ptr;
              ppvVar10 = (void **)(pwVar3 + (local_40->super_SegmentReader).ptr.size_);
              if (((long)pwVar3 - (long)ppvVar1 >> 3 <= lVar8) &&
                 (lVar8 <= (long)ppvVar10 - (long)ppvVar1 >> 3)) {
                ppvVar10 = ppvVar1 + lVar8;
              }
            }
            goto LAB_00128374;
          }
          pAVar4 = (local_40->super_SegmentReader).arena;
          iVar6 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)*(uint *)((long)&pDVar13->left + 4));
          newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar6);
          _kjCondition.left = &newSegment;
          _kjCondition.right = (void *)0x0;
          _kjCondition.op.content.ptr = " != ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
          if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                      ((Fault *)&size,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x25f,FAILED,"newSegment != nullptr",
                       "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                       &_kjCondition,
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_00128361:
            ppvVar10 = (void **)0x0;
            kj::_::Debug::Fault::~Fault((Fault *)&size);
          }
          else {
            uVar11 = *(uint *)&pDVar13->left & 3;
            _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar11);
            _kjCondition.right = anon_var_dwarf_1d86e;
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ = (size_t)(uVar11 == 2);
            if (uVar11 != 2) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                        ((Fault *)&size,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                         "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                         (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                          *)&_kjCondition,
                         (char (*) [51])"Second word of double-far pad must be far pointer.");
              goto LAB_00128361;
            }
            uVar7 = (ulong)(*(uint *)&pDVar13->left >> 3);
            uVar9 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
            if ((long)uVar9 < (long)uVar7) {
              uVar7 = uVar9;
            }
            ppvVar10 = (void **)((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr +
                                uVar7);
            local_40 = (SegmentBuilder *)newSegment;
          }
          pDVar13 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&pDVar13->right;
          unaff_R15 = pDVar13;
          goto LAB_00128374;
        }
        uVar12 = 2 - (ulong)((uVar11 & 4) == 0);
        if (uVar9 < uVar7 + uVar12) {
          newSegment = (SegmentReader *)((ulong)newSegment._1_7_ << 8);
        }
        else {
          pRVar5 = (local_40->super_SegmentReader).readLimiter;
          uVar9 = pRVar5->limit;
          if (uVar9 < uVar12) {
            (*((local_40->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          else {
            pRVar5->limit = uVar9 - uVar12;
          }
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar12 <= uVar9);
          if (uVar12 <= uVar9) goto LAB_001281a8;
        }
        unaff_R15 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)unaff_R15,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
      kj::_::Debug::Fault::~Fault((Fault *)unaff_R15);
      ppvVar10 = (void **)0x0;
      pDVar13 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)this;
    }
LAB_00128374:
    bVar14 = ppvVar10 == (void **)0x0;
    if (!bVar14) {
      size = *(uint *)((long)&pDVar13->left + 4) >> 3;
      uVar11 = *(uint *)&pDVar13->left & 3;
      _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar11);
      _kjCondition.right = anon_var_dwarf_1d86e;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar11 == 1);
      if (uVar11 == 1) {
        bVar2 = *(byte *)((long)&pDVar13->left + 4);
        _kjCondition.left =
             (SegmentReader **)(CONCAT71(_kjCondition.left._1_7_,bVar2) & 0xffffffffffffff07);
        _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
        _kjCondition.right = anon_var_dwarf_1d86e;
        _kjCondition.op.content.ptr = (char *)0x5;
        bVar14 = (bVar2 & 7) == 2;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar14);
        if (bVar14) {
          if (local_40 == (SegmentBuilder *)0x0) {
            bVar14 = true;
          }
          else {
            uVar9 = (ulong)(size + 7 >> 3);
            if ((local_40->super_SegmentReader).ptr.size_ <
                ((long)ppvVar10 - (long)(local_40->super_SegmentReader).ptr.ptr >> 3) + uVar9) {
              bVar14 = false;
            }
            else {
              pRVar5 = (local_40->super_SegmentReader).readLimiter;
              uVar7 = pRVar5->limit;
              bVar14 = uVar7 >= uVar9;
              if (uVar7 < uVar9) {
                (*((local_40->super_SegmentReader).arena)->_vptr_Arena[3])();
              }
              else {
                pRVar5->limit = uVar7 - uVar9;
              }
            }
          }
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar14);
          if (bVar14 == false) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9ac,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                       "_kjCondition,\"Message contained out-of-bounds text pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&newSegment,
                       (char (*) [320])
                       "Message contained out-of-bounds text pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
            iVar6 = 2;
          }
          else {
            _kjCondition.left = (SegmentReader **)&size;
            _kjCondition.right = (void *)((ulong)_kjCondition.right & 0xffffffff00000000);
            _kjCondition.op.content.ptr = " > ";
            _kjCondition.op.content.size_ = 4;
            _kjCondition.result = size != 0;
            if (_kjCondition.result) {
              uVar9 = (ulong)(size - 1);
              _kjCondition.result = *(char *)((long)ppvVar10 + uVar9) == '\0';
              _kjCondition.left = (SegmentReader **)((long)ppvVar10 + uVar9);
              _kjCondition.op.content.ptr = " == ";
              _kjCondition.op.content.size_ = 5;
              if (_kjCondition.result) {
                iVar6 = 1;
              }
              else {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<char_const&,char>&,char_const(&)[50]>
                          ((Fault *)&newSegment,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x9b7,FAILED,"cptr[unboundedSize] == \'\\0\'",
                           "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                           (DebugComparison<const_char_&,_char> *)&_kjCondition,
                           (char (*) [50])"Message contains text that is not NUL-terminated.");
                kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
                iVar6 = 2;
              }
              unaff_R15 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)(uVar9 + 1)
              ;
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[50]>
                        ((Fault *)&newSegment,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x9b0,FAILED,"size > ZERO * BYTES",
                         "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                         (DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                         (char (*) [50])"Message contains text that is not NUL-terminated.");
              kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
              iVar6 = 2;
            }
          }
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                    ((Fault *)&newSegment,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9a6,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                     "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where text was \" \"expected.\""
                     ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                     (char (*) [85])
                     "Schema mismatch: Message contains list pointer of non-bytes where text was expected."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
          iVar6 = 2;
        }
      }
      else {
        unaff_R15 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                  ((Fault *)unaff_R15,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9a0,FAILED,"ref->kind() == WirePointer::LIST",
                   "_kjCondition,\"Schema mismatch: Message contains non-list pointer where text was expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    &_kjCondition,
                   (char (*) [76])
                   "Schema mismatch: Message contains non-list pointer where text was expected.");
        kj::_::Debug::Fault::~Fault((Fault *)unaff_R15);
        iVar6 = 2;
      }
      bVar14 = iVar6 == 2;
    }
    if (!bVar14) goto LAB_0012865b;
  }
  unaff_R15 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)0x1;
  ppvVar10 = (void **)0x19950d;
LAB_0012865b:
  RVar15.super_StringPtr.content.size_ = (size_t)unaff_R15;
  RVar15.super_StringPtr.content.ptr = (char *)ppvVar10;
  return (Reader)RVar15.super_StringPtr.content;
}

Assistant:

Text::Reader OrphanBuilder::asTextReader() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readTextPointer(segment, tagAsPtr(), location, nullptr, ZERO * BYTES);
}